

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTPNArglist * __thiscall CTcPrsOpBinGroupCompare::parse_inlist(CTcPrsOpBinGroupCompare *this)

{
  tc_toktyp_t tVar1;
  CTcPrsNode *pCVar2;
  CTPNArgBase *prv;
  CTPNArglist *pCVar3;
  CTPNArg *list_head;
  CTcPrsOpAsi *in_stack_00000018;
  CTPNArg *arg_cur;
  CTcPrsNode *expr;
  CTPNArg *arg_tail;
  CTPNArg *arg_head;
  int argc;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CTcTokenizer *in_stack_ffffffffffffff90;
  CTcTokenizer *in_stack_ffffffffffffff98;
  int argc_00;
  CTPNArglist *in_stack_ffffffffffffffa0;
  CTPNArgBase *local_28;
  
  tVar1 = CTcTokenizer::next(in_stack_ffffffffffffff98);
  if (tVar1 == TOKT_LPAR) {
    CTcTokenizer::next(in_stack_ffffffffffffff98);
  }
  else {
    CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  local_28 = (CTPNArgBase *)0x0;
  while (tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2520ab), tVar1 != TOKT_RPAR) {
    pCVar2 = CTcPrsOpAsi::parse(in_stack_00000018);
    if (pCVar2 == (CTcPrsNode *)0x0) {
      return (CTPNArglist *)0x0;
    }
    prv = (CTPNArgBase *)CTcPrsAllocObj::operator_new(0x2520f0);
    CTPNArg::CTPNArg((CTPNArg *)in_stack_ffffffffffffff90,
                     (CTcPrsNode *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (local_28 != (CTPNArgBase *)0x0) {
      CTPNArgBase::set_next_arg(local_28,(CTPNArg *)prv);
    }
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x25216f);
    if (tVar1 == TOKT_RPAR) break;
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x252188);
    local_28 = prv;
    if (tVar1 == TOKT_COMMA) {
      CTcTokenizer::next(in_stack_ffffffffffffff98);
    }
    else {
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2521b0);
      if (((tVar1 - TOKT_DSTR_MID < 2) || (tVar1 - TOKT_LBRACE < 2)) || (tVar1 == TOKT_SEM)) {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        pCVar3 = (CTPNArglist *)CTcPrsAllocObj::operator_new(0x252285);
        CTPNArglist::CTPNArglist
                  (in_stack_ffffffffffffffa0,(int)((ulong)pCVar3 >> 0x20),
                   (CTPNArg *)in_stack_ffffffffffffff90);
        return pCVar3;
      }
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x25220a);
      if (tVar1 == TOKT_EOF) {
        pCVar3 = (CTPNArglist *)CTcPrsAllocObj::operator_new(0x252219);
        CTPNArglist::CTPNArglist
                  (pCVar3,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (CTPNArg *)in_stack_ffffffffffffff90);
        return pCVar3;
      }
    }
  }
  CTcTokenizer::next(in_stack_ffffffffffffff98);
  argc_00 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  list_head = (CTPNArg *)CTcPrsAllocObj::operator_new(0x2522f0);
  CTPNArglist::CTPNArglist(in_stack_ffffffffffffffa0,argc_00,list_head);
  return (CTPNArglist *)list_head;
}

Assistant:

CTPNArglist *CTcPrsOpBinGroupCompare::parse_inlist() const
{
    int argc;
    CTPNArg *arg_head;
    CTPNArg *arg_tail;

    /* skip the second keyword token, and check for an open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going on the assumption that it was
         *   merely omitted and the rest of the list is well-formed 
         */
        G_tok->log_error_curtok(TCERR_IN_REQ_LPAR);
    }

    /* keep going until we find the close paren */
    for (argc = 0, arg_head = arg_tail = 0 ;; )
    {
        CTcPrsNode *expr;
        CTPNArg *arg_cur;

        /* if this is the close paren, we're done */
        if (G_tok->cur() == TOKT_RPAR)
            break;

        /* parse this expression */
        expr = S_op_asi.parse();
        if (expr == 0)
            return 0;

        /* count the argument */
        ++argc;

        /* create a new argument node */
        arg_cur = new CTPNArg(expr);

        /* 
         *   link the new node at the end of our list (this preserves the
         *   order of the original list) 
         */
        if (arg_tail != 0)
            arg_tail->set_next_arg(arg_cur);
        else
            arg_head = arg_cur;
        arg_tail = arg_cur;

        /* we need to be looking at a comma or right paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* that's the end of the list */
            break;
        }
        else if (G_tok->cur() == TOKT_COMMA)
        {
            /* skip the comma and parse the next argument */
            G_tok->next();
        }
        else
        {
            /* 
             *   If we're at the end of the file, there's no point
             *   proceding, so return failure.  If we've reached something
             *   that looks like a statement separator (semicolon, curly
             *   brace), also return failure, since the problem is clearly
             *   a missing right paren.  Otherwise, assume that a comma
             *   was missing and continue as though we have another
             *   argument.  
             */
            switch(G_tok->cur())
            {
            default:
                /* log an error */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_COMMA);

                /* 
                 *   if we're at the end of file, return what we have so
                 *   far; otherwise continue, assuming that they merely
                 *   left out a comma between two argument expressions 
                 */
                if (G_tok->cur() == TOKT_EOF)
                    return new CTPNArglist(argc, arg_head);
                break;

            case TOKT_SEM:
            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_DSTR_MID:
            case TOKT_DSTR_END:
                /* 
                 *   we're apparently at the end of the statement; flag
                 *   the error as a missing right paren, and return what
                 *   we have so far 
                 */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_RPAR);
                return new CTPNArglist(argc, arg_head);
            }
        }
    }

    /* skip the closing paren */
    G_tok->next();

    /* create and return the argument list descriptor */
    return new CTPNArglist(argc, arg_head);
}